

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ReverseSeqLayerParams::SerializeWithCachedSizes
          (ReverseSeqLayerParams *this,CodedOutputStream *output)

{
  if (this->batchaxis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->batchaxis_,output);
  }
  if (this->sequenceaxis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->sequenceaxis_,output);
    return;
  }
  return;
}

Assistant:

void ReverseSeqLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReverseSeqLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 batchAxis = 1;
  if (this->batchaxis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->batchaxis(), output);
  }

  // int64 sequenceAxis = 2;
  if (this->sequenceaxis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->sequenceaxis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReverseSeqLayerParams)
}